

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_CryptoError.h
# Opt level: O0

bignum_st *
axl::cry::completeWithLastCryptoError<bignum_st*>(bignum_st *result,bignum_st *failResult)

{
  bignum_st *in_RSI;
  bignum_st *in_RDI;
  
  if (in_RDI == in_RSI) {
    setLastCryptoError();
  }
  return in_RDI;
}

Assistant:

T
completeWithLastCryptoError(
	T result,
	T failResult
) {
	if (result == failResult)
		setLastCryptoError();

	return result;
}